

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

void __thiscall
cfd::core::MerkleBlock::TraverseAndBuild
          (MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids,
          vector<bool,_std::allocator<bool>_> *matches)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t height_00;
  Txid local_a0;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  uVar1 = pos << ((byte)height & 0x3f);
  uVar2 = pos + 1 << ((byte)height & 0x3f);
  if (this->transaction_count <= uVar2) {
    uVar2 = this->transaction_count;
  }
  if (uVar1 < uVar2) {
    do {
      uVar3 = uVar1 + 0x3f;
      if (-1 < (long)uVar1) {
        uVar3 = uVar1;
      }
      if (((matches->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar3 >> 6) +
            (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar1 & 0x3f) & 1) != 0) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&this->bits_,true);
        if (height == 0) goto LAB_004e0250;
        height_00 = height - 1;
        ::std::vector<bool,_std::allocator<bool>_>::vector(&local_80,matches);
        TraverseAndBuild(this,height_00,pos * 2,txids,&local_80);
        if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        uVar2 = pos * 2 | 1;
        if (~(-1L << ((byte)height_00 & 0x3f)) + this->transaction_count >> ((byte)height_00 & 0x3f)
            <= uVar2) {
          return;
        }
        ::std::vector<bool,_std::allocator<bool>_>::vector(&local_58,matches);
        TraverseAndBuild(this,height_00,uVar2,txids,&local_58);
        goto joined_r0x004e0247;
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)&this->bits_,false);
  if (height == 0) {
LAB_004e0250:
    Txid::Txid(&local_a0,
               (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_start + pos);
  }
  else {
    CalculateHash(&local_a0,this,height,pos,txids);
  }
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::emplace_back<cfd::core::Txid>
            (&this->txids_,&local_a0);
  local_a0._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (_Bit_pointer)
       local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
joined_r0x004e0247:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void MerkleBlock::TraverseAndBuild(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids,
    const std::vector<bool> matches) {
  bool has_parent_of_match = false;
  for (uint64_t index = pos << height;
       (index < ((pos + 1) << height)) && (index < transaction_count);
       ++index) {
    if (matches[index]) {
      has_parent_of_match = true;
      break;
    }
  }
  bits_.push_back(has_parent_of_match);
  if ((height == 0) || (!has_parent_of_match)) {
    // if at height 0, or nothing interesting below, store hash and stop
    txids_.push_back(CalculateHash(height, pos, txids));
  } else {
    TraverseAndBuild(height - 1, pos * 2, txids, matches);
    if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
      TraverseAndBuild(height - 1, pos * 2 + 1, txids, matches);
    }
  }
}